

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestInfo * __thiscall testing::TestSuite::GetTestInfo(TestSuite *this,int i)

{
  pointer piVar1;
  uint uVar2;
  
  uVar2 = 0xffffffff;
  if ((-1 < i) &&
     (piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2))) {
    uVar2 = piVar1[(uint)i];
  }
  if (-1 < (int)uVar2) {
    return (this->test_info_list_).
           super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar2];
  }
  return (TestInfo *)0x0;
}

Assistant:

const TestInfo* TestSuite::GetTestInfo(int i) const {
  const int index = GetElementOr(test_indices_, i, -1);
  return index < 0 ? nullptr : test_info_list_[static_cast<size_t>(index)];
}